

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.cc
# Opt level: O2

string * __thiscall
rcdiscover::(anonymous_namespace)::extract_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,uint8_t *p,size_t len)

{
  uint8_t *puVar1;
  ostringstream out;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  for (puVar1 = (uint8_t *)0x0; (this[(long)puVar1] != (_anonymous_namespace_)0x0 && (p != puVar1));
      puVar1 = puVar1 + 1) {
    std::operator<<((ostream *)local_1a0,(char)this[(long)puVar1]);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string extract(const uint8_t *p, size_t len)
{
  std::ostringstream out;

  while (*p != 0 && len > 0)
  {
    out << static_cast<char>(*p);

    p++;
    len--;
  }

  return out.str();
}